

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::CollationSettings::setCaseFirst
          (CollationSettings *this,UColAttributeValue value,int32_t defaultOptions,
          UErrorCode *errorCode)

{
  uint uVar1;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  uVar1 = this->options & 0xfffffcff;
  if (value < UCOL_LOWER_FIRST) {
    if (value == UCOL_DEFAULT) {
      uVar1 = uVar1 | defaultOptions & 0x300U;
    }
    else if (value != UCOL_OFF) goto LAB_00238aa3;
  }
  else {
    if (value != UCOL_LOWER_FIRST) {
      if (value == UCOL_UPPER_FIRST) {
        this->options = this->options | 0x300;
        return;
      }
LAB_00238aa3:
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      return;
    }
    uVar1 = uVar1 | 0x200;
  }
  this->options = uVar1;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }